

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

_Bool al_get_next_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  ALLEGRO_EVENT *pAVar1;
  long lVar2;
  ALLEGRO_EVENT *pAVar3;
  byte bVar4;
  
  bVar4 = 0;
  heartbeat();
  _al_mutex_lock(&queue->mutex);
  pAVar1 = get_next_event_if_any(queue,true);
  if (pAVar1 != (ALLEGRO_EVENT *)0x0) {
    pAVar3 = pAVar1;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)ret_event = *(undefined8 *)pAVar3;
      pAVar3 = (ALLEGRO_EVENT *)((long)pAVar3 + (ulong)bVar4 * -0x10 + 8);
      ret_event = (ALLEGRO_EVENT *)((long)ret_event + (ulong)bVar4 * -0x10 + 8);
    }
  }
  _al_mutex_unlock(&queue->mutex);
  return pAVar1 != (ALLEGRO_EVENT *)0x0;
}

Assistant:

bool al_get_next_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);
   ASSERT(ret_event);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, true);
   if (next_event) {
      copy_event(ret_event, next_event);
      /* Don't increment reference count on user events. */
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}